

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_disp_matrix_orient(char *mesg,mat44 mat)

{
  FILE *__stream;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int k;
  int j;
  int i;
  
  if (mesg != (char *)0x0) {
    fputs(mesg,_stderr);
  }
  nifti_mat44_to_orientation(mat,&i,&j,&k);
  __stream = _stderr;
  if (k < 1 || (j < 1 || i < 1)) {
    iVar4 = -1;
  }
  else {
    pcVar1 = nifti_orientation_string(i);
    pcVar2 = nifti_orientation_string(j);
    pcVar3 = nifti_orientation_string(k);
    iVar4 = 0;
    fprintf(__stream,
            "  i orientation = \'%s\'\n  j orientation = \'%s\'\n  k orientation = \'%s\'\n",pcVar1,
            pcVar2,pcVar3);
  }
  return iVar4;
}

Assistant:

int nifti_disp_matrix_orient( const char * mesg, mat44 mat )
{
   int i, j, k;

   if ( mesg ) fputs( mesg, stderr );  /* use stdout? */

   nifti_mat44_to_orientation( mat, &i,&j,&k );
   if ( i <= 0 || j <= 0 || k <= 0 ) return -1;

   /* so we have good codes */
   fprintf(stderr, "  i orientation = '%s'\n"
                   "  j orientation = '%s'\n"
                   "  k orientation = '%s'\n",
                   nifti_orientation_string(i),
                   nifti_orientation_string(j),
                   nifti_orientation_string(k) );
   return 0;
}